

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O0

void __thiscall QGraphicsGridLayout::removeAt(QGraphicsGridLayout *this,int index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QGraphicsGridLayoutPrivate *pQVar4;
  QGraphicsGridLayoutEngineItem *this_00;
  QGraphicsLayoutItem *pQVar5;
  const_iterator pOVar6;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int newCount;
  int oldCount;
  Orientation orient;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<Qt::Orientation> *__range2;
  QGraphicsLayoutItem *layoutItem;
  QGraphicsGridLayoutEngineItem *gridItem;
  QGraphicsGridLayoutPrivate *d;
  QGraphicsLayoutItem *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  const_iterator local_78;
  initializer_list<Qt::Orientation> local_40;
  char local_30 [32];
  Orientation local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QGraphicsGridLayout *)0x96e324);
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffff64 = in_ESI;
    iVar1 = QGridLayoutEngine::itemCount();
    if ((int)in_stack_ffffffffffffff64 < iVar1) {
      iVar1 = (int)pQVar4;
      this_00 = (QGraphicsGridLayoutEngineItem *)QGridLayoutEngine::itemAt(iVar1 + 0x118);
      if (this_00 != (QGraphicsGridLayoutEngineItem *)0x0) {
        pQVar5 = QGraphicsGridLayoutEngineItem::layoutItem(this_00);
        if (pQVar5 != (QGraphicsLayoutItem *)0x0) {
          QGraphicsLayoutItem::setParentLayoutItem
                    ((QGraphicsLayoutItem *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
        }
        QGridLayoutEngine::removeItem((QGridLayoutItem *)&pQVar4->engine);
        local_10[0] = Horizontal;
        local_10[1] = 2;
        local_40._M_array = local_10;
        local_40._M_len = 2;
        local_78 = std::initializer_list<Qt::Orientation>::begin(&local_40);
        pOVar6 = std::initializer_list<Qt::Orientation>::end
                           ((initializer_list<Qt::Orientation> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        for (; local_78 != pOVar6; local_78 = local_78 + 1) {
          iVar2 = QGridLayoutEngine::rowCount(iVar1 + 0x118);
          iVar3 = QGridLayoutItem::lastRow((Orientation)this_00);
          if (iVar3 == iVar2 + -1) {
            QGridLayoutEngine::effectiveLastRow(iVar1 + 0x118);
            QGridLayoutEngine::removeRows
                      ((QGridLayoutEngine *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (int)in_stack_ffffffffffffff58,0);
          }
        }
        if (this_00 != (QGraphicsGridLayoutEngineItem *)0x0) {
          (**(code **)(*(long *)this_00 + 8))();
        }
        (**(code **)(*in_RDI + 0x38))();
      }
      goto LAB_0096e509;
    }
  }
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char *)in_RDI,in_stack_ffffffffffffff64,(char *)in_stack_ffffffffffffff58);
  QMessageLogger::warning(local_30,"QGraphicsGridLayout::removeAt: invalid index %d",(ulong)in_ESI);
LAB_0096e509:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::removeAt(int index)
{
    Q_D(QGraphicsGridLayout);
    if (index < 0 || index >= d->engine.itemCount()) {
        qWarning("QGraphicsGridLayout::removeAt: invalid index %d", index);
        return;
    }

    if (QGraphicsGridLayoutEngineItem *gridItem = static_cast<QGraphicsGridLayoutEngineItem*>(d->engine.itemAt(index))) {
        if (QGraphicsLayoutItem *layoutItem = gridItem->layoutItem())
            layoutItem->setParentLayoutItem(nullptr);
        d->engine.removeItem(gridItem);

        // recalculate rowInfo.count if we remove an item that is on the right/bottommost row
        for (const Qt::Orientation orient : {Qt::Horizontal, Qt::Vertical}) {
            const int oldCount = d->engine.rowCount(orient);
            if (gridItem->lastRow(orient) == oldCount - 1) {
                const int newCount = d->engine.effectiveLastRow(orient) + 1;
                d->engine.removeRows(newCount, oldCount - newCount, orient);
            }
        }

        delete gridItem;
        invalidate();
    }
}